

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage3d_neg_width_height_depth
               (NegativeTestContext *ctx)

{
  int imageSize;
  allocator<char> local_45;
  deUint32 texture;
  string local_40;
  
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,texture);
  imageSize = etc2EacDataSize(0x10,0x10);
  glu::CallLogWrapper::glCompressedTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x9278,0x10,0x10,1,0,imageSize,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE or GL_INVALID_OPERATION is generated if width, height or depth are negative."
             ,&local_45);
  NegativeTestContext::beginSection(ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0,0,0,-4,0,0,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501,0x502);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0,0,0,0,-4,0,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501,0x502);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0,0,0,0,0,-4,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501,0x502);
  glu::CallLogWrapper::glCompressedTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0,0,0,-4,-4,-4,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void compressedtexsubimage3d_neg_width_height_depth (NegativeTestContext& ctx)
{
	deUint32				texture = 0x1234;
	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D_ARRAY, texture);
	ctx.glCompressedTexImage3D	(GL_TEXTURE_2D_ARRAY, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 16, 16, 1, 0, etc2EacDataSize(16, 16), 0);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE or GL_INVALID_OPERATION is generated if width, height or depth are negative.");
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, -4, 0, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, 0, -4, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, 0, 0, -4, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, -4, -4, -4, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteTextures		(1, &texture);
}